

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

UResourceBundle *
ures_findSubResource_63(UResourceBundle *resB,char *path,UResourceBundle *fillIn,UErrorCode *status)

{
  UResourceBundle *pUVar1;
  Resource r;
  ResourceData *pResData;
  char *path_local;
  char *key;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    pResData = &resB->fResData;
    path_local = path;
    r = res_findResource_63(pResData,resB->fRes,&path_local,&key);
    pUVar1 = fillIn;
    if (r != 0xffffffff) {
      do {
        resB = init_resb_result(pResData,r,key,-1,resB->fData,resB,0,fillIn,status);
        if (*path_local == '\0') {
          return resB;
        }
        pResData = &resB->fResData;
        r = res_findResource_63(pResData,resB->fRes,&path_local,&key);
        pUVar1 = resB;
      } while (r != 0xffffffff);
    }
    fillIn = pUVar1;
    *status = U_MISSING_RESOURCE_ERROR;
  }
  return fillIn;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2
ures_findSubResource(const UResourceBundle *resB, char* path, UResourceBundle *fillIn, UErrorCode *status) 
{
  Resource res = RES_BOGUS;
  UResourceBundle *result = fillIn;
  const char *key;

  if(status == NULL || U_FAILURE(*status)) {
    return result;
  }

  /* here we do looping and circular alias checking */
  /* this loop is here because aliasing is resolved on this level, not on res level */
  /* so, when we encounter an alias, it is not an aggregate resource, so we return */
  do {
    res = res_findResource(&(resB->fResData), resB->fRes, &path, &key); 
    if(res != RES_BOGUS) {
        result = init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        resB = result;
    } else {
        *status = U_MISSING_RESOURCE_ERROR;
        break;
    }
  } while(*path); /* there is more stuff in the path */

  return result;
}